

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O2

char * MULTILABEL::bufcache_label(labels *ld,char *c)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  
  *(long *)c = (long)(ld->label_v)._end - (long)(ld->label_v)._begin >> 2;
  puVar2 = (uint *)(c + 8);
  uVar3 = 0;
  while( true ) {
    puVar1 = (ld->label_v)._begin;
    if ((ulong)((long)(ld->label_v)._end - (long)puVar1 >> 2) <= (ulong)uVar3) break;
    *puVar2 = puVar1[uVar3];
    puVar2 = puVar2 + 1;
    uVar3 = uVar3 + 1;
  }
  return (char *)puVar2;
}

Assistant:

char* bufcache_label(labels* ld, char* c)
{
  *(size_t*)c = ld->label_v.size();
  c += sizeof(size_t);
  for (unsigned int i = 0; i < ld->label_v.size(); i++)
  {
    *(uint32_t*)c = ld->label_v[i];
    c += sizeof(uint32_t);
  }
  return c;
}